

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTreeWalker.cpp
# Opt level: O2

GdlGlyphClassDefn * __thiscall
GrcManager::ConvertClassToIntersection
          (GrcManager *this,Symbol psymClass,GdlGlyphClassDefn *pglfc,GrpLineAndFile *lnf)

{
  long lVar1;
  GdlGlyphIntersectionClassDefn *this_00;
  Symbol this_01;
  string staAnonClassName;
  string staName;
  string local_b0 [32];
  string local_90;
  string local_70 [32];
  string local_50 [32];
  
  if ((pglfc == (GdlGlyphClassDefn *)0x0) ||
     (lVar1 = __dynamic_cast(pglfc,&GdlGlyphClassDefn::typeinfo,
                             &GdlGlyphIntersectionClassDefn::typeinfo,0), lVar1 == 0)) {
    this_00 = (GdlGlyphIntersectionClassDefn *)operator_new(0x140);
    GdlGlyphIntersectionClassDefn::GdlGlyphIntersectionClassDefn(this_00);
    GrpLineAndFile::operator=
              (&(this_00->super_GdlGlyphClassDefn).super_GdlGlyphClassMember.super_GdlDefn.
                super_GdlObject.m_lnf,lnf);
    std::__cxx11::string::string(local_50,(string *)&pglfc->m_staName);
    std::__cxx11::string::string(local_70,local_50);
    std::__cxx11::string::_M_assign((string *)&(this_00->super_GdlGlyphClassDefn).m_staName);
    std::__cxx11::string::~string(local_70);
    this_01 = GrcSymbolTable::AddAnonymousClassSymbol
                        (this->m_psymtbl,
                         &(pglfc->super_GdlGlyphClassMember).super_GdlDefn.super_GdlObject.m_lnf);
    GrcSymbolTableEntry::FullName_abi_cxx11_(&local_90,this_01);
    std::__cxx11::string::string(local_b0,(string *)&local_90);
    std::__cxx11::string::_M_assign((string *)&pglfc->m_staName);
    std::__cxx11::string::~string(local_b0);
    GrcSymbolTableEntry::ReplaceClassData(this_01,pglfc);
    GdlGlyphIntersectionClassDefn::AddSet(this_00,&pglfc->super_GdlGlyphClassMember,lnf);
    psymClass->m_pData = (GdlDefn *)this_00;
    psymClass->m_fHasData = true;
    GdlRenderer::AddGlyphClass(this->m_prndr,(GdlGlyphClassDefn *)this_00);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string(local_50);
    pglfc = (GdlGlyphClassDefn *)this_00;
  }
  return &((GdlGlyphIntersectionClassDefn *)pglfc)->super_GdlGlyphClassDefn;
}

Assistant:

GdlGlyphClassDefn * GrcManager::ConvertClassToIntersection(Symbol psymClass,
	GdlGlyphClassDefn * pglfc, GrpLineAndFile & lnf)
{
	GdlGlyphClassDefn * pglfcRet;

	GdlGlyphIntersectionClassDefn * pglfci
			= dynamic_cast<GdlGlyphIntersectionClassDefn *>(pglfc);
	if (pglfci)
	{
		// Already an intersection class.
		pglfcRet = pglfc;
	}
	else
	{
		GdlGlyphIntersectionClassDefn * pglfciNew = new GdlGlyphIntersectionClassDefn();
		pglfciNew->SetLineAndFile(lnf);
		std::string staName = pglfc->Name();
		pglfciNew->SetName(staName);

		Symbol psymAnonClass = SymbolTable()->AddAnonymousClassSymbol(pglfc->LineAndFile());
		std::string staAnonClassName = psymAnonClass->FullName();
		pglfc->SetName(staAnonClassName);
		psymAnonClass->ReplaceClassData(pglfc);

		// Make the original class one of the set elements of the intersection.
		pglfciNew->AddSet(pglfc, lnf);
		psymClass->SetData(pglfciNew);

		pglfcRet = dynamic_cast<GdlGlyphClassDefn *>(pglfciNew);
		m_prndr->AddGlyphClass(pglfcRet);
	}

	return pglfcRet;
}